

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O1

wchar_t cmd_get_arg_point(command_conflict *cmd,char *arg,loc *grid)

{
  bool bVar1;
  int iVar2;
  wchar_t wVar3;
  loc in_RCX;
  long lVar4;
  char *__s1;
  
  __s1 = cmd->arg[0].name;
  lVar4 = 4;
  do {
    iVar2 = strcmp(__s1,arg);
    if (iVar2 == 0) {
      wVar3 = L'\0';
      if (((cmd_arg *)(__s1 + -0x10))->type == arg_POINT) {
        in_RCX = *(loc *)(__s1 + -8);
        bVar1 = true;
      }
      else {
        wVar3 = L'\xfffffffe';
        bVar1 = false;
      }
      goto LAB_001307c6;
    }
    __s1 = __s1 + 0x28;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  bVar1 = false;
  wVar3 = L'\xffffffff';
LAB_001307c6:
  if (bVar1) {
    *grid = in_RCX;
  }
  return wVar3;
}

Assistant:

int cmd_get_arg_point(struct command *cmd, const char *arg, struct loc *grid)
{
	union cmd_arg_data data;
	int err;

	if ((err = cmd_get_arg(cmd, arg, arg_POINT, &data)) == CMD_OK) {
		*grid = data.point;
	}

	return err;
}